

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Create.hpp
# Opt level: O1

Gen<char> * rc::gen::just<char>(Gen<char> *__return_storage_ptr__,char *value)

{
  _func_int **pp_Var1;
  IGenImpl *pIVar2;
  _func_int **local_20;
  
  rc::shrinkable::just<char>((shrinkable *)&local_20,value);
  pp_Var1 = local_20;
  local_20 = (_func_int **)0x0;
  pIVar2 = (IGenImpl *)operator_new(0x18);
  pIVar2->_vptr_IGenImpl = (_func_int **)&PTR_generate_001b4000;
  pIVar2[1]._vptr_IGenImpl = pp_Var1;
  pIVar2[2]._vptr_IGenImpl = (_func_int **)0x1;
  __return_storage_ptr__->m_impl = pIVar2;
  (__return_storage_ptr__->m_name)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_name).field_2;
  (__return_storage_ptr__->m_name)._M_string_length = 0;
  (__return_storage_ptr__->m_name).field_2._M_local_buf[0] = '\0';
  if (local_20 != (_func_int **)0x0) {
    (**(code **)((long)*local_20 + 0x18))();
  }
  return __return_storage_ptr__;
}

Assistant:

Gen<Decay<T>> just(T &&value) {
  return fn::constant(shrinkable::just(std::forward<T>(value)));
}